

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Line_AlignCeiling
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  int linenum;
  uint uVar2;
  FLineIdIterator local_20;
  
  local_20.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
  local_20.searchtag = arg0;
  linenum = FLineIdIterator::Next(&local_20);
  if (linenum < 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      bVar1 = P_AlignFlat(linenum,(uint)(arg1 != 0),1);
      uVar2 = (uint)(byte)((byte)uVar2 | bVar1);
      linenum = FLineIdIterator::Next(&local_20);
    } while (-1 < linenum);
  }
  return uVar2;
}

Assistant:

FUNC(LS_Line_AlignCeiling)
// Line_AlignCeiling (lineid, side)
{
	bool ret = 0;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		ret |= P_AlignFlat (line, !!arg1, 1);
	}
	return ret;
}